

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cc
# Opt level: O3

void __thiscall entityx::EntityManager::reset(EntityManager *this)

{
  pointer ppBVar1;
  pointer ppBVar2;
  pointer pbVar3;
  pointer puVar4;
  Id entity;
  pointer ppBVar5;
  pointer ppBVar6;
  Iterator __begin1;
  Iterator __end1;
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> local_68;
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> local_40;
  
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::ViewIterator
            (&local_68,this,(ComponentMask)0xffffffffffffffff,0);
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next(&local_68);
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::ViewIterator
            (&local_40,this,(ComponentMask)0xffffffffffffffff,
             (uint32_t)
             ((ulong)((long)(this->entity_component_mask_).
                            super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->entity_component_mask_).
                           super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next(&local_40);
  if (local_68.i_ != local_40.i_) {
    do {
      entity.id_._4_4_ =
           ((local_68.manager_)->entity_version_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[local_68.i_];
      entity.id_._0_4_ = local_68.i_;
      destroy(local_68.manager_,entity);
      local_68.i_ = local_68.i_ + 1;
      ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next(&local_68);
    } while (local_68.i_ != local_40.i_);
  }
  ppBVar1 = (this->component_pools_).
            super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->component_pools_).
                 super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar1; ppBVar5 = ppBVar5 + 1
      ) {
    if (*ppBVar5 != (BasePool *)0x0) {
      (*(*ppBVar5)->_vptr_BasePool[1])();
    }
  }
  ppBVar2 = (this->component_helpers_).
            super__Vector_base<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this->component_helpers_).
                 super__Vector_base<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar2;
      ppBVar6 = ppBVar6 + 1) {
    if (*ppBVar6 != (BaseComponentHelper *)0x0) {
      (**(code **)(*(long *)*ppBVar6 + 8))();
    }
  }
  ppBVar5 = (this->component_pools_).
            super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->component_pools_).
      super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar5) {
    (this->component_pools_).
    super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar5;
  }
  ppBVar6 = (this->component_helpers_).
            super__Vector_base<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->component_helpers_).
      super__Vector_base<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppBVar6) {
    (this->component_helpers_).
    super__Vector_base<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppBVar6;
  }
  pbVar3 = (this->entity_component_mask_).
           super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->entity_component_mask_).
      super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar3) {
    (this->entity_component_mask_).
    super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar3;
  }
  puVar4 = (this->entity_version_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->entity_version_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->entity_version_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  puVar4 = (this->free_list_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->free_list_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->free_list_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  this->index_counter_ = 0;
  return;
}

Assistant:

void EntityManager::reset() {
  for (Entity entity : entities_for_debugging()) entity.destroy();
  for (BasePool *pool : component_pools_) {
    if (pool) delete pool;
  }
  for (BaseComponentHelper *helper : component_helpers_) {
    if (helper) delete helper;
  }
  component_pools_.clear();
  component_helpers_.clear();
  entity_component_mask_.clear();
  entity_version_.clear();
  free_list_.clear();
  index_counter_ = 0;
}